

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LEB128.h
# Opt level: O0

uint64_t decodeULEB128(uint8_t *p,uint *n)

{
  uint uVar1;
  byte bVar2;
  uint *puVar3;
  uint64_t uStack_28;
  uint Shift;
  uint64_t Value;
  uint8_t *orig_p;
  uint *n_local;
  uint8_t *p_local;
  
  uStack_28 = 0;
  bVar2 = 0;
  n_local = (uint *)p;
  do {
    uStack_28 = (long)(int)(((byte)*n_local & 0x7f) << (bVar2 & 0x1f)) + uStack_28;
    bVar2 = bVar2 + 7;
    puVar3 = (uint *)((long)n_local + 1);
    uVar1 = *n_local;
    n_local = puVar3;
  } while (0x7f < (byte)uVar1);
  if (n != (uint *)0x0) {
    *n = (int)puVar3 - (int)p;
  }
  return uStack_28;
}

Assistant:

static inline uint64_t decodeULEB128(const uint8_t *p, unsigned *n)
{
	const uint8_t *orig_p = p;
	uint64_t Value = 0;
	unsigned Shift = 0;
	do {
		Value += (*p & 0x7f) << Shift;
		Shift += 7;
	} while (*p++ >= 128);
	if (n)
		*n = (unsigned)(p - orig_p);
	return Value;
}